

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O3

int io_readline(lua_State *L)

{
  code *pcVar1;
  int iVar2;
  int iVar3;
  undefined8 *puVar4;
  lua_Integer lVar5;
  void *pvVar6;
  char *pcVar7;
  int iVar8;
  lua_CFunction cf;
  
  puVar4 = (undefined8 *)lua_touserdata(L,-0xf4629);
  lVar5 = lua_tointegerx(L,-0xf462a,(int *)0x0);
  if (puVar4[1] == 0) {
    iVar3 = luaL_error(L,"file is already closed");
    return iVar3;
  }
  lua_settop(L,1);
  iVar3 = (int)lVar5;
  luaL_checkstack(L,iVar3,"too many arguments");
  if (0 < iVar3) {
    iVar8 = -0xf462c;
    do {
      lua_pushvalue(L,iVar8);
      iVar2 = iVar3 + -1 + iVar8;
      iVar8 = iVar8 + -1;
    } while (iVar2 != -0xf462c);
  }
  iVar3 = g_read(L,(FILE *)*puVar4,2);
  if (0 < iVar3) {
    iVar8 = lua_toboolean(L,-iVar3);
    if (iVar8 == 0) {
      if (iVar3 != 1) {
        pcVar7 = lua_tolstring(L,1 - iVar3,(size_t *)0x0);
        iVar3 = luaL_error(L,"%s",pcVar7);
        return iVar3;
      }
      iVar8 = lua_toboolean(L,-0xf462b);
      iVar3 = 0;
      if (iVar8 != 0) {
        lua_settop(L,0);
        lua_pushvalue(L,-0xf4629);
        pvVar6 = luaL_checkudata(L,1,"FILE*");
        pcVar1 = *(code **)((long)pvVar6 + 8);
        *(undefined8 *)((long)pvVar6 + 8) = 0;
        (*pcVar1)(L);
      }
    }
    return iVar3;
  }
  __assert_fail("n > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/liolib.c"
                ,0x259,"int io_readline(lua_State *)");
}

Assistant:

static int io_readline (lua_State *L) {
  LStream *p = (LStream *)lua_touserdata(L, lua_upvalueindex(1));
  int i;
  int n = (int)lua_tointeger(L, lua_upvalueindex(2));
  if (isclosed(p))  /* file is already closed? */
    return luaL_error(L, "file is already closed");
  lua_settop(L , 1);
  luaL_checkstack(L, n, "too many arguments");
  for (i = 1; i <= n; i++)  /* push arguments to 'g_read' */
    lua_pushvalue(L, lua_upvalueindex(3 + i));
  n = g_read(L, p->f, 2);  /* 'n' is number of results */
  lua_assert(n > 0);  /* should return at least a nil */
  if (lua_toboolean(L, -n))  /* read at least one value? */
    return n;  /* return them */
  else {  /* first result is nil: EOF or error */
    if (n > 1) {  /* is there error information? */
      /* 2nd result is error message */
      return luaL_error(L, "%s", lua_tostring(L, -n + 1));
    }
    if (lua_toboolean(L, lua_upvalueindex(3))) {  /* generator created file? */
      lua_settop(L, 0);
      lua_pushvalue(L, lua_upvalueindex(1));
      aux_close(L);  /* close it */
    }
    return 0;
  }
}